

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_stone_skin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (((bVar1) || (bVar1 = is_affected(in_RCX,(int)gsn_diamondskin), bVar1)) ||
     (bVar1 = is_affected(in_RCX,(int)gsn_ironskin), bVar1)) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x61aec5);
    get_spell_aftype(in_stack_ffffffffffffff68);
    affect_to_char(in_stack_ffffffffffffff70,(AFFECT_DATA *)in_stack_ffffffffffffff68);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void spell_stone_skin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn) || is_affected(victim, gsn_diamondskin) || is_affected(victim, gsn_ironskin))
	{
		if (victim == ch)
			send_to_char("Your skin is already magically hardened.\n\r", ch);
		else
			act("$N's skin is already magically hardened.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 3;
	af.location = APPLY_AC;
	af.modifier = level / 4;
	affect_to_char(victim, &af);

	act("$n's skin turns to stone.", victim, nullptr, nullptr, TO_ROOM);
	send_to_char("Your skin turns to stone.\n\r", victim);
}